

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkclean.c
# Opt level: O3

void UpdateCues(ebml_master *Cues,ebml_master *Segment)

{
  matroska_cuepoint *pmVar1;
  err_t eVar2;
  
  if (Cues != (ebml_master *)0x0) {
    do {
      pmVar1 = (matroska_cuepoint *)(((matroska_cuepoint *)Cues)->Base).Base.Base.Next;
      if ((matroska_cuepoint *)Cues == pmVar1) {
        __assert_fail("(nodetree*)(Cue) != ((nodetree*)(Cue))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/mkclean/mkclean.c"
                      ,0x158,"void UpdateCues(ebml_master *, ebml_master *)");
      }
      eVar2 = MATROSKA_CuePointUpdate((matroska_cuepoint *)Cues,&Segment->Base,DstProfile);
      if (eVar2 != 0) {
        NodeDelete((node *)Cues);
      }
      Cues = (ebml_master *)pmVar1;
    } while (pmVar1 != (matroska_cuepoint *)0x0);
  }
  return;
}

Assistant:

static void UpdateCues(ebml_master *Cues, ebml_master *Segment)
{
    ebml_master *Cue,*NextCue;

    // reevaluate the size needed for the Cues
    for (Cue=(ebml_master*)EBML_MasterChildren(Cues);Cue;Cue=NextCue)
    {
        NextCue =(ebml_master*)EBML_MasterNext(Cue);
        if (MATROSKA_CuePointUpdate((matroska_cuepoint*)Cue, (ebml_element*)Segment, DstProfile)!=ERR_NONE)
        {
            NodeDelete((node*)Cue);
        }
    }
}